

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgclient.c
# Opt level: O0

int mg_session_begin_transaction(mg_session *session,mg_map *extra_run_information)

{
  int iVar1;
  mg_session *in_RDI;
  mg_session *unaff_retaddr;
  int failure_status;
  mg_message *response;
  int status;
  mg_allocator *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  mg_session *in_stack_ffffffffffffffd8;
  int local_1c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI->version == 1) {
    mg_session_set_error(in_RDI,"Transaction are not supported in this version");
  }
  if (in_RDI->status == 2) {
    mg_session_set_error(in_RDI,"bad session");
    local_1c = -0xf;
  }
  else if (in_RDI->status == 1) {
    mg_session_set_error(in_RDI,"Cannot start a transaction while a query is executing");
    local_1c = -0xf;
  }
  else if (in_RDI->status == 3) {
    mg_session_set_error(in_RDI,"fetching result of a query");
    local_1c = -0xf;
  }
  else if (in_RDI->explicit_transaction == 0) {
    mg_message_destroy_ca
              ((mg_message *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    (in_RDI->result).message = (mg_message *)0x0;
    local_1c = mg_session_send_begin_message
                         (in_stack_ffffffffffffffd8,
                          (mg_map *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (((local_1c == 0) &&
        (local_1c = mg_session_receive_message
                              ((mg_session *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
        local_1c == 0)) &&
       (local_1c = mg_session_read_bolt_message
                             ((mg_session *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              (mg_message **)in_RDI), local_1c == 0)) {
      if (in_stack_ffffffffffffffd8->status == 1) {
        mg_message_destroy_ca
                  ((mg_message *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
        in_RDI->explicit_transaction = 1;
        in_RDI->query_number = 0;
        return 0;
      }
      if (in_stack_ffffffffffffffd8->status == 2) {
        iVar1 = handle_failure_message
                          (unaff_retaddr,
                           (mg_message_failure *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        local_1c = handle_failure(in_stack_ffffffffffffffd8);
        if (local_1c == 0) {
          mg_message_destroy_ca
                    ((mg_message *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
          return iVar1;
        }
      }
      else {
        local_1c = -10;
        mg_message_destroy_ca
                  ((mg_message *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
        mg_session_set_error(in_RDI,"unexpected message type");
      }
    }
    mg_session_invalidate((mg_session *)0x106b78);
  }
  else {
    mg_session_set_error(in_RDI,"Transaction already started");
    local_1c = -0xf;
  }
  return local_1c;
}

Assistant:

int mg_session_begin_transaction(mg_session *session,
                                 const mg_map *extra_run_information) {
  if (session->version == 1) {
    mg_session_set_error(session,
                         "Transaction are not supported in this version");
  }
  if (session->status == MG_SESSION_BAD) {
    mg_session_set_error(session, "bad session");
    return MG_ERROR_BAD_CALL;
  }
  if (session->status == MG_SESSION_EXECUTING) {
    mg_session_set_error(
        session, "Cannot start a transaction while a query is executing");
    return MG_ERROR_BAD_CALL;
  }
  if (session->status == MG_SESSION_FETCHING) {
    mg_session_set_error(session, "fetching result of a query");
    return MG_ERROR_BAD_CALL;
  }
  if (session->explicit_transaction) {
    mg_session_set_error(session, "Transaction already started");
    return MG_ERROR_BAD_CALL;
  }
  assert(session->status == MG_SESSION_READY && !session->explicit_transaction);

  mg_message_destroy_ca(session->result.message, session->decoder_allocator);
  session->result.message = NULL;
  // TODO(aandelic): Check if the columns should be destroyed

  if (!extra_run_information) {
    extra_run_information = &mg_empty_map;
  }

  int status = 0;
  status = mg_session_send_begin_message(session, extra_run_information);
  if (status != 0) {
    goto fatal_failure;
  }

  status = mg_session_receive_message(session);
  if (status != 0) {
    goto fatal_failure;
  }

  mg_message *response;
  status = mg_session_read_bolt_message(session, &response);
  if (status != 0) {
    goto fatal_failure;
  }

  if (response->type == MG_MESSAGE_TYPE_SUCCESS) {
    mg_message_destroy_ca(response, session->decoder_allocator);
    session->explicit_transaction = 1;
    session->query_number = 0;
    return 0;
  }

  if (response->type == MG_MESSAGE_TYPE_FAILURE) {
    int failure_status = handle_failure_message(session, response->failure_v);

    status = handle_failure(session);
    if (status != 0) {
      goto fatal_failure;
    }

    mg_message_destroy_ca(response, session->decoder_allocator);
    return failure_status;
  }

  status = MG_ERROR_PROTOCOL_VIOLATION;
  mg_message_destroy_ca(response, session->decoder_allocator);
  mg_session_set_error(session, "unexpected message type");

fatal_failure:
  mg_session_invalidate(session);
  assert(status != 0);
  return status;
}